

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportBuildFileGenerator::GenerateMainFile(cmExportBuildFileGenerator *this,ostream *os)

{
  long *plVar1;
  pointer *pppcVar2;
  iterator __position;
  cmake *this_00;
  cmGeneratorTarget *target;
  TargetType TVar3;
  PolicyStatus PVar4;
  undefined8 *puVar5;
  string *psVar6;
  ostream *poVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined8 uVar9;
  pointer ppcVar10;
  pointer name;
  bool bVar11;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar12;
  string expectedTargets;
  cmGeneratorTarget *te;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  ostringstream e;
  string local_268;
  ostream *local_248;
  cmGeneratorTarget *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *local_1c0;
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8 [2];
  ios_base local_138 [264];
  
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268._M_string_length = 0;
  local_268.field_2._M_local_buf[0] = '\0';
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_238._M_string_length = 0;
  local_238.field_2._M_allocated_capacity =
       local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_248 = os;
  GetTargets(this,&local_1d8);
  bVar11 = local_1d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_1d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar11) {
    local_1b0 = &(this->super_cmExportFileGenerator).Namespace;
    local_1b8 = (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                 *)&(this->super_cmExportFileGenerator).ExportedTargets;
    local_1c0 = (vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)&this->Exports;
    name = local_1d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_240 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,name);
      std::operator+(&local_218,&local_238,local_1b0);
      cmGeneratorTarget::GetExportName_abi_cxx11_(&local_1f8,local_240);
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        uVar9 = local_218.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_1f8._M_string_length + local_218._M_string_length) {
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          uVar9 = local_1f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_1f8._M_string_length + local_218._M_string_length)
        goto LAB_0033b963;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_218._M_dataplus._M_p);
      }
      else {
LAB_0033b963:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_218,(ulong)local_1f8._M_dataplus._M_p);
      }
      local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent;
      plVar1 = puVar5 + 2;
      if ((_Base_ptr *)*puVar5 == (_Base_ptr *)plVar1) {
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar1;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar5[3];
      }
      else {
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar1;
        local_1a8[0]._M_impl._0_8_ = (_Base_ptr *)*puVar5;
      }
      local_1a8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar5[1];
      *puVar5 = plVar1;
      puVar5[1] = 0;
      *(undefined1 *)plVar1 = 0;
      std::__cxx11::string::_M_append((char *)&local_268,local_1a8[0]._M_impl._0_8_);
      if ((_Base_ptr *)local_1a8[0]._M_impl._0_8_ !=
          &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)local_1a8[0]._M_impl._0_8_,
                        (ulong)((long)&(local_1a8[0]._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_238,0,(char *)local_238._M_string_length,0x56700d);
      pVar12 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>(local_1b8,&local_240);
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"given target \"",0xe);
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(local_240);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" more than once.",0x11);
        this_00 = this->LG->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmMakefile::GetBacktrace((cmListFileBacktrace *)&local_1f8,this->LG->Makefile);
        cmake::IssueMessage(this_00,FATAL_ERROR,&local_218,(cmListFileBacktrace *)&local_1f8);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        __position._M_current =
             (this->Exports).
             super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->Exports).
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
          _M_realloc_insert<cmGeneratorTarget*const&>(local_1c0,__position,&local_240);
        }
        else {
          *__position._M_current = local_240;
          pppcVar2 = &(this->Exports).
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppcVar2 = *pppcVar2 + 1;
        }
        TVar3 = cmGeneratorTarget::GetType(local_240);
        if (TVar3 == INTERFACE_LIBRARY) {
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                    (this,local_248,"3.0.0");
        }
      }
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_0033bbfd;
      name = name + 1;
      bVar11 = name == local_1d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar11);
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])(this,local_248,&local_268)
  ;
LAB_0033bbfd:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  if (bVar11 != false) {
    local_238._M_dataplus._M_p = (pointer)0x0;
    local_238._M_string_length = 0;
    local_238.field_2._M_allocated_capacity = 0;
    ppcVar10 = (this->Exports).
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppcVar10 !=
        (this->Exports).
        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        paVar8 = &local_268.field_2;
        target = *ppcVar10;
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])(this,local_248,target)
        ;
        cmTarget::AppendBuildInterfaceIncludes(target->Target);
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_1a8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1a8[0]._M_impl.super__Rb_tree_header._M_header;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_268._M_dataplus._M_p = (pointer)paVar8;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_INCLUDE_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar8) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"INTERFACE_SOURCES","")
        ;
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar8) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_COMPILE_DEFINITIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar8) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_COMPILE_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar8) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_AUTOUIC_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar8) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_COMPILE_FEATURES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar8) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_POSITION_INDEPENDENT_CODE","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,target,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar8) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        PVar4 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022);
        if (PVar4 != WARN) {
          PVar4 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022);
          if (PVar4 != OLD) {
            cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                      (&this->super_cmExportFileGenerator,target,BuildInterface,
                       (ImportPropertyMap *)local_1a8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_238);
          }
        }
        cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                  (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)local_1a8);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                  (this,target,local_248);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_1a8);
        ppcVar10 = ppcVar10 + 1;
      } while (ppcVar10 !=
               (this->Exports).
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    psVar6 = (this->super_cmExportFileGenerator).Configurations.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (psVar6 != (this->super_cmExportFileGenerator).Configurations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        cmExportFileGenerator::GenerateImportConfig
                  (&this->super_cmExportFileGenerator,local_248,psVar6,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        psVar6 = psVar6 + 1;
      } while (psVar6 != (this->super_cmExportFileGenerator).Configurations.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])
              (this,local_248,&local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_238);
  }
  return bVar11;
}

Assistant:

bool cmExportBuildFileGenerator::GenerateMainFile(std::ostream& os)
{
  {
    std::string expectedTargets;
    std::string sep;
    std::vector<std::string> targets;
    this->GetTargets(targets);
    for (std::vector<std::string>::const_iterator tei = targets.begin();
         tei != targets.end(); ++tei) {
      cmGeneratorTarget* te = this->LG->FindGeneratorTargetToUse(*tei);
      expectedTargets += sep + this->Namespace + te->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te).second) {
        this->Exports.push_back(te);
      } else {
        std::ostringstream e;
        e << "given target \"" << te->GetName() << "\" more than once.";
        this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
          cmake::FATAL_ERROR, e.str(),
          this->LG->GetMakefile()->GetBacktrace());
        return false;
      }
      if (te->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        this->GenerateRequiredCMakeVersion(os, "3.0.0");
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  std::vector<std::string> missingTargets;

  // Create all the imported targets.
  for (std::vector<cmGeneratorTarget*>::const_iterator tei =
         this->Exports.begin();
       tei != this->Exports.end(); ++tei) {
    cmGeneratorTarget* gte = *tei;
    this->GenerateImportTargetCode(os, gte);

    gte->Target->AppendBuildInterfaceIncludes();

    ImportPropertyMap properties;

    this->PopulateInterfaceProperty("INTERFACE_INCLUDE_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SOURCES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gte,
                                    properties);
    const bool newCMP0022Behavior =
      gte->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gte->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      this->PopulateInterfaceLinkLibrariesProperty(
        gte, cmGeneratorExpression::BuildInterface, properties,
        missingTargets);
    }
    this->PopulateCompatibleInterfaceProperties(gte, properties);

    this->GenerateInterfaceProperties(gte, os, properties);
  }

  // Generate import file content for each configuration.
  for (std::vector<std::string>::const_iterator ci =
         this->Configurations.begin();
       ci != this->Configurations.end(); ++ci) {
    this->GenerateImportConfig(os, *ci, missingTargets);
  }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return true;
}